

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorDebug.cpp
# Opt level: O0

void debugPivotValueAnalysis
               (HighsInt highs_debug_level,HighsLogOptions *log_options,HighsInt num_row,
               vector<double,_std::allocator<double>_> *u_pivot_value)

{
  const_reference pvVar1;
  double *pdVar2;
  vector<double,_std::allocator<double>_> *in_RCX;
  uint in_EDX;
  undefined8 in_RSI;
  int in_EDI;
  double dVar3;
  double abs_pivot;
  HighsInt iRow;
  double max_pivot;
  double mean_pivot;
  double min_pivot;
  value_type local_48;
  int local_3c;
  char *local_38;
  double local_30;
  HighsLogOptions *local_28;
  vector<double,_std::allocator<double>_> *local_20;
  uint local_14;
  undefined8 local_10;
  int local_4;
  
  if (0 < in_EDI) {
    local_28 = (HighsLogOptions *)0x7ff0000000000000;
    local_30 = 0.0;
    local_38 = (char *)0x0;
    local_20 = in_RCX;
    local_14 = in_EDX;
    local_10 = in_RSI;
    local_4 = in_EDI;
    for (local_3c = 0; local_3c < (int)local_14; local_3c = local_3c + 1) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_3c);
      local_48 = ABS(*pvVar1);
      pdVar2 = std::min<double>(&local_48,(double *)&local_28);
      local_28 = (HighsLogOptions *)*pdVar2;
      pdVar2 = std::max<double>(&local_48,(double *)&local_38);
      local_38 = (char *)*pdVar2;
      dVar3 = log(local_48);
      local_30 = dVar3 + local_30;
    }
    local_30 = exp(local_30 / (double)(int)local_14);
    if ((1 < local_4) || ((double)local_28 < 1e-08)) {
      highsLogDev(local_28,SUB84(local_30,0),local_38,local_10,5,
                  "InvertPivotAnalysis: %d pivots: Min %g; Mean %g; Max %g\n",(ulong)local_14);
    }
  }
  return;
}

Assistant:

void debugPivotValueAnalysis(const HighsInt highs_debug_level,
                             const HighsLogOptions& log_options,
                             const HighsInt num_row,
                             const vector<double>& u_pivot_value) {
  if (highs_debug_level < kHighsDebugLevelCheap) return;
  double min_pivot = kHighsInf;
  double mean_pivot = 0;
  double max_pivot = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    double abs_pivot = fabs(u_pivot_value[iRow]);
    min_pivot = min(abs_pivot, min_pivot);
    max_pivot = max(abs_pivot, max_pivot);
    mean_pivot += log(abs_pivot);
  }
  mean_pivot = exp(mean_pivot / num_row);
  if (highs_debug_level > kHighsDebugLevelCheap || min_pivot < 1e-8)
    highsLogDev(log_options, HighsLogType::kError,
                "InvertPivotAnalysis: %" HIGHSINT_FORMAT
                " pivots: Min %g; Mean "
                "%g; Max %g\n",
                num_row, min_pivot, mean_pivot, max_pivot);
}